

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_huge_container_count(void)

{
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *bitmap;
  size_t valid_size;
  uint8_t data [655378];
  uint8_t data_begin [8];
  size_t in_stack_fffffffffff5ffc8;
  char *file;
  unsigned_long b;
  char *expression;
  unsigned_long in_stack_fffffffffff5ffe0;
  char *in_stack_fffffffffff5ffe8;
  
  b = 0x100000000303a;
  memset(&stack0xfffffffffff5ffe0,0,0xa000a);
  file = (char *)0xa0008;
  roaring_bitmap_portable_deserialize_size((char *)0xa0008,in_stack_fffffffffff5ffc8);
  _assert_int_equal(in_stack_fffffffffff5ffe0,b,file,(int)(in_stack_fffffffffff5ffc8 >> 0x20));
  expression = (char *)CONCAT35((int3)(b >> 0x28),CONCAT14((char)(b >> 0x20) + '\x01',(int)b));
  roaring_bitmap_portable_deserialize_size(file,in_stack_fffffffffff5ffc8);
  _assert_int_equal(in_stack_fffffffffff5ffe0,(unsigned_long)expression,file,
                    (int)(in_stack_fffffffffff5ffc8 >> 0x20));
  prVar1 = roaring_bitmap_portable_deserialize_safe
                     (in_stack_fffffffffff5ffe8,in_stack_fffffffffff5ffe0);
  _assert_true(in_stack_fffffffffff5ffe0,expression,file,(int)((ulong)prVar1 >> 0x20));
  return;
}

Assistant:

DEFINE_TEST(deserialize_huge_container_count) {
    // clang-format off
    const uint8_t data_begin[] = {
        0x3A, 0x30, 0, 0,       // Serial Cookie No Run Container
        0x00, 0x00, 0x01, 0x00, // Container count (MAX_CONTAINERS + 1)
    };
    // clang-format on
#define EXTRA_DATA(num_containers) \
    ((num_containers) * (3 * sizeof(uint16_t) + sizeof(uint32_t)))

    // For each container, 32 bits for container offset,
    //   16 bits each for a key, cardinality - 1, and a value
    uint8_t data[sizeof(data_begin) + EXTRA_DATA(MAX_CONTAINERS + 1)];
    memcpy(data, data_begin, sizeof(data_begin));
    memset(data + sizeof(data_begin), 0, EXTRA_DATA(MAX_CONTAINERS + 1));

    size_t valid_size = sizeof(data_begin) + EXTRA_DATA(MAX_CONTAINERS);
    assert_int_equal(
        roaring_bitmap_portable_deserialize_size((const char*)data, valid_size),
        valid_size);

    // Add an extra container
    data[4] += 1;
    assert_int_equal(roaring_bitmap_portable_deserialize_size((const char*)data,
                                                              sizeof(data)),
                     0);
    roaring_bitmap_t* bitmap = roaring_bitmap_portable_deserialize_safe(
        (const char*)data, sizeof(data));
    assert_null(bitmap);
#undef EXTRA_DATA
}